

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereLoopClear(sqlite3 *db,WhereLoop *p)

{
  if (p->aLTerm != p->aLTermSpace) {
    sqlite3DbFreeNN(db,p->aLTerm);
  }
  whereLoopClearUnion(db,p);
  p->aLTerm = p->aLTermSpace;
  p->nLTerm = 0;
  p->nLSlot = 3;
  p->wsFlags = 0;
  return;
}

Assistant:

static void whereLoopClear(sqlite3 *db, WhereLoop *p){
  if( p->aLTerm!=p->aLTermSpace ) sqlite3DbFreeNN(db, p->aLTerm);
  whereLoopClearUnion(db, p);
  whereLoopInit(p);
}